

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

OptBuilder __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::operator[]
          (CommandLine<Catch::ConfigData> *this,string *optName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string *in_RDX;
  OptBuilder *builder;
  Arg local_d8;
  
  paVar1 = &local_d8.super_CommonArgProperties<Catch::ConfigData>.description.field_2;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.boundField.functionObj =
       (IArgFunction<Catch::ConfigData> *)0x0;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.description._M_string_length = 0;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.description.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_d8.super_CommonArgProperties<Catch::ConfigData>.detail.field_2;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.detail._M_string_length = 0;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.detail.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_d8.super_CommonArgProperties<Catch::ConfigData>.placeholder.field_2;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.placeholder._M_string_length = 0;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.placeholder.field_2._M_local_buf[0] = '\0';
  local_d8.super_OptionArgProperties.shortNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super_OptionArgProperties.shortNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super_OptionArgProperties.shortNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar4 = &local_d8.super_OptionArgProperties.longName.field_2;
  local_d8.super_OptionArgProperties.longName._M_string_length = 0;
  local_d8.super_OptionArgProperties.longName.field_2._M_local_buf[0] = '\0';
  local_d8.super_PositionalArgProperties.position = -1;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.description._M_dataplus._M_p =
       (pointer)paVar1;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.detail._M_dataplus._M_p = (pointer)paVar2;
  local_d8.super_CommonArgProperties<Catch::ConfigData>.placeholder._M_dataplus._M_p =
       (pointer)paVar3;
  local_d8.super_OptionArgProperties.longName._M_dataplus._M_p = (pointer)paVar4;
  std::
  vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::emplace_back<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>
            ((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
              *)&optName->_M_string_length,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super_OptionArgProperties.longName._M_dataplus._M_p != paVar4) {
    operator_delete(local_d8.super_OptionArgProperties.longName._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8.super_OptionArgProperties.shortNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super_CommonArgProperties<Catch::ConfigData>.placeholder._M_dataplus._M_p !=
      paVar3) {
    operator_delete(local_d8.super_CommonArgProperties<Catch::ConfigData>.placeholder._M_dataplus.
                    _M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super_CommonArgProperties<Catch::ConfigData>.detail._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8.super_CommonArgProperties<Catch::ConfigData>.detail._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super_CommonArgProperties<Catch::ConfigData>.description._M_dataplus._M_p !=
      paVar1) {
    operator_delete(local_d8.super_CommonArgProperties<Catch::ConfigData>.description._M_dataplus.
                    _M_p);
  }
  if (local_d8.super_CommonArgProperties<Catch::ConfigData>.boundField.functionObj !=
      (IArgFunction<Catch::ConfigData> *)0x0) {
    (*(local_d8.super_CommonArgProperties<Catch::ConfigData>.boundField.functionObj)->
      _vptr_IArgFunction[1])();
  }
  addOptName((Arg *)((optName->field_2)._M_allocated_capacity - 0xa8),in_RDX);
  (this->m_boundProcessName).functionObj =
       (IArgFunction<Catch::ConfigData> *)((optName->field_2)._M_allocated_capacity - 0xa8);
  return (OptBuilder)(ArgBuilder)this;
}

Assistant:

OptBuilder operator[]( std::string const& optName ) {
            m_options.push_back( Arg() );
            addOptName( m_options.back(), optName );
            OptBuilder builder( &m_options.back() );
            return builder;
        }